

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O3

int main(int argC,char **argV)

{
  char *pcVar1;
  bool gDoSchema;
  bool gSchemaFullChecking;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  bool bVar7;
  bool gDoNamespaces;
  ulong uVar8;
  ulong uVar9;
  
  if (1 < argC) {
    uVar8 = 1;
    gSchemaFullChecking = false;
    gDoSchema = false;
    gDoNamespaces = false;
    do {
      pcVar1 = argV[uVar8];
      uVar9 = uVar8;
      if (*pcVar1 != '-') break;
      if ((pcVar1[1] == '?') && (pcVar1[2] == '\0')) {
        usage();
        return 2;
      }
      if (((pcVar1[1] == 'n') && (pcVar1[2] == '\0')) || ((pcVar1[1] == 'N' && (pcVar1[2] == '\0')))
         ) {
        gDoNamespaces = true;
      }
      else if (((pcVar1[1] == 's') && (pcVar1[2] == '\0')) ||
              ((pcVar1[1] == 'S' && (pcVar1[2] == '\0')))) {
        gDoSchema = true;
      }
      else if (((pcVar1[1] == 'f') && (pcVar1[2] == '\0')) ||
              ((pcVar1[1] == 'F' && (pcVar1[2] == '\0')))) {
        gSchemaFullChecking = true;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown option \'",0x10);
        pcVar1 = argV[uVar8];
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107178);
        }
        else {
          sVar5 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\', ignoring it.\n",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
      }
      uVar8 = uVar8 + 1;
      uVar9 = (ulong)(uint)argC;
    } while ((uint)argC != uVar8);
    if ((int)uVar9 + 1 == argC) {
      pcVar1 = argV[uVar9 & 0xffffffff];
      iVar6 = 100;
      bVar7 = false;
      do {
        if (bVar7) goto LAB_001035e9;
        iVar2 = TestInit4DOM(pcVar1,gDoNamespaces,gDoSchema,gSchemaFullChecking,Once);
        iVar3 = TestInit4SAX(pcVar1,gDoNamespaces,gDoSchema,gSchemaFullChecking,Once);
        iVar4 = TestInit4SAX2(pcVar1,gDoNamespaces,gDoSchema,gSchemaFullChecking,Once);
        if (iVar4 != 0 || (iVar3 != 0 || iVar2 != 0)) {
          bVar7 = true;
        }
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      if (((((!bVar7) &&
            (iVar6 = TestInit4DOM(pcVar1,gDoNamespaces,gDoSchema,gSchemaFullChecking,Multiple),
            iVar6 == 0)) &&
           (iVar6 = TestInit4SAX(pcVar1,gDoNamespaces,gDoSchema,gSchemaFullChecking,Multiple),
           iVar6 == 0)) &&
          ((iVar6 = TestInit4SAX2(pcVar1,gDoNamespaces,gDoSchema,gSchemaFullChecking,Multiple),
           iVar6 == 0 &&
           (iVar6 = TestInit4DOM(pcVar1,gDoNamespaces,gDoSchema,gSchemaFullChecking,UnEven),
           iVar6 == 0)))) &&
         ((iVar6 = TestInit4SAX(pcVar1,gDoNamespaces,gDoSchema,gSchemaFullChecking,UnEven),
          iVar6 == 0 &&
          (iVar6 = TestInit4SAX2(pcVar1,gDoNamespaces,gDoSchema,gSchemaFullChecking,UnEven),
          iVar6 == 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Test Run Successfully",0x15);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
        std::ostream::put('p');
        std::ostream::flush();
        return 0;
      }
LAB_001035e9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test Failed",0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      return 4;
    }
  }
  usage();
  return 1;
}

Assistant:

int main(int argC, char* argV[]) {

    // ---------------------------------------------------------------------------
    //  Local data
    //
    //  gDoNamespaces
    //      Indicates whether namespace processing should be done.
    //
    //  gDoSchema
    //      Indicates whether schema processing should be done.
    //
    //  gSchemaFullChecking
    //      Indicates whether full schema constraint checking should be done.
    //
    // ---------------------------------------------------------------------------
    bool gDoNamespaces          = false;
    bool gDoSchema              = false;
    bool gSchemaFullChecking    = false;

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    // See if non validating dom parser configuration is requested.
    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            gDoNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            gDoSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            gSchemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it.\n" << std::endl;
        }
    }

    //
    //  And now we have to have only one parameter left and it must be
    //  the file name.
    //
    if (parmInd + 1 != argC)
    {
        usage();
        return 1;
    }

    char* xmlFile = argV[parmInd];
    bool error = false;

    //
    // Calling Init/Term pair a number of times
    //
    unsigned int i = 0;
    for (i=0; i < 100; i++) {
        if (error) {
            std::cout << "Test Failed" << std::endl;
            return 4;
        }

        if (TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Once))
            error = true;
        if (TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Once))
            error = true;
        if (TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Once))
            error = true;
    }

    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Multiple))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Multiple))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Multiple))
        error = true;
/*
 * The following Limit test is a stress test that can run a long time
 * Commented out for regular sanity test
 */
/*
    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Limit))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Limit))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Limit))
        error = true;

    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, ExceedLimit))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, ExceedLimit))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, ExceedLimit))
        error = true;
*/

    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, UnEven))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, UnEven))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, UnEven))
        error = true;

    if (error) {
        std::cout << "Test Failed" << std::endl;
        return 4;
    }

    std::cout << "Test Run Successfully" << std::endl;
    return 0;
}